

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

void Cnf_AddCardinConstrTest(void)

{
  int iVar1;
  Vec_Int_t *vVars;
  int *piVar2;
  sat_solver *s;
  long lVar3;
  uint uVar4;
  
  vVars = (Vec_Int_t *)malloc(0x10);
  vVars->nCap = 0x10;
  vVars->nSize = 0;
  piVar2 = (int *)malloc(0x40);
  vVars->pArray = piVar2;
  vVars->nSize = 8;
  lVar3 = 0;
  do {
    piVar2[lVar3] = (int)lVar3;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  s = sat_solver_new();
  sat_solver_setnvars(s,8);
  Cnf_AddCardinConstrPairWise(s,vVars,2,1);
  uVar4 = 1;
  do {
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (iVar1 != 1) break;
    vVars->nSize = 0;
    iVar1 = 0;
    printf("%3d : ",(ulong)uVar4);
    lVar3 = 0;
    do {
      if (s->size <= lVar3) {
LAB_0058ad16:
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      Vec_IntPush(vVars,(uint)(s->model[lVar3] == 1) + iVar1);
      if (s->size <= lVar3) goto LAB_0058ad16;
      printf("%d",(ulong)(s->model[lVar3] == 1));
      lVar3 = lVar3 + 1;
      iVar1 = iVar1 + 2;
    } while (lVar3 != 8);
    putchar(10);
    iVar1 = sat_solver_addclause(s,vVars->pArray,vVars->pArray + vVars->nSize);
    uVar4 = uVar4 + 1;
  } while (iVar1 != 0);
  sat_solver_delete(s);
  if (vVars->pArray != (int *)0x0) {
    free(vVars->pArray);
    vVars->pArray = (int *)0x0;
  }
  free(vVars);
  return;
}

Assistant:

void Cnf_AddCardinConstrTest()
{
    int i, status, Count = 1, nVars = 8;
    Vec_Int_t * vVars = Vec_IntStartNatural( nVars );
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars );
    //Cnf_AddCardinConstr( pSat, vVars );
    Cnf_AddCardinConstrPairWise( pSat, vVars, 2, 1 );
    while ( 1 )
    {
        status = sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( status != l_True )
            break;
        Vec_IntClear( vVars );
        printf( "%3d : ", Count++ );
        for ( i = 0; i < nVars; i++ )
        {
            Vec_IntPush( vVars, Abc_Var2Lit(i, sat_solver_var_value(pSat, i)) );
            printf( "%d", sat_solver_var_value(pSat, i) );
        }
        printf( "\n" );
        status = sat_solver_addclause( pSat, Vec_IntArray(vVars), Vec_IntArray(vVars) + Vec_IntSize(vVars) );
        if ( status == 0 )
            break;
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vVars );
}